

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenBuffer.cpp
# Opt level: O1

RefToken __thiscall antlr::TokenBuffer::LT(TokenBuffer *this,uint i)

{
  TokenRef *pTVar1;
  uint in_EDX;
  undefined4 in_register_00000034;
  TokenBuffer *this_00;
  
  this_00 = (TokenBuffer *)CONCAT44(in_register_00000034,i);
  fill(this_00,in_EDX);
  pTVar1 = (this_00->queue).storage.
           super__Vector_base<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>
           ._M_impl.super__Vector_impl_data._M_start
           [(this_00->queue).m_offset + (ulong)((this_00->markerOffset + in_EDX) - 1)].ref;
  if (pTVar1 == (TokenRef *)0x0) {
    pTVar1 = (TokenRef *)0x0;
  }
  else {
    pTVar1->count = pTVar1->count + 1;
  }
  this->_vptr_TokenBuffer = (_func_int **)pTVar1;
  return (RefToken)(TokenRef *)this;
}

Assistant:

RefToken TokenBuffer::LT(unsigned int i)
{
	fill(i);
	return queue.elementAt(markerOffset+i-1);
}